

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void ma_error(ErrorLevel elevel,ErrorType etype,char *func,char *emsg)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  int in_EDI;
  char *s2;
  char *s1;
  char *local_28;
  char *local_20;
  
  if (((in_EDI == 0) || (ma_hard_fail != 0)) || (ma_error_print != 0)) {
    if (in_ESI == 1) {
      local_20 = "internal ";
    }
    else {
      local_20 = "";
    }
    if (in_EDI == 0) {
      local_28 = "fatal error";
    }
    else if (ma_hard_fail == 0) {
      local_28 = "error";
    }
    else {
      local_28 = "hard failure";
    }
    fflush(_stdout);
    fflush(_stderr);
    fprintf(_stderr,"MA %s%s: %s: %s\n",local_20,local_28,in_RDX,in_RCX);
    fflush(_stderr);
  }
  if ((in_EDI == 0) || (ma_hard_fail != 0)) {
    if (ma_func_terminate == (_func_void_char_ptr_int *)0x0) {
      exit(1);
    }
    (*ma_func_terminate)("MA aborting",0);
  }
  return;
}

Assistant:

public void ma_error(ErrorLevel elevel, ErrorType etype, char *func, char *emsg)
{
    /* print a message? */
    if ((elevel == EL_Fatal) || ma_hard_fail || ma_error_print)
    {
        char *s1; /* internal or not */
        char *s2; /* class of error */

        /* set s1 */
        if (etype == ET_Internal) {
            s1 = "internal ";
        } else {
            s1 = "";
        }

        /* set s2 */
        if (elevel == EL_Fatal) {
            s2 = "fatal error";
        } else if (ma_hard_fail) {
            s2 = "hard failure";
        } else {
            s2 = "error";
        }

        /* print the message */
        (void)fflush(stdout);
        (void)fflush(stderr);
        (void)fprintf(stderr, "MA %s%s: %s: %s\n", s1, s2, func, emsg);
        (void)fflush(stderr);
    }

    /* terminate execution? */
    if ((elevel == EL_Fatal) || ma_hard_fail) {
        if(ma_func_terminate) {
            ma_func_terminate("MA aborting",0);
        } else {
            exit(1);
        }
    }
}